

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxVisitor.h
# Opt level: O3

void __thiscall
slang::syntax::SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter>::
visitDefault<slang::syntax::UdpSimpleFieldSyntax&>
          (SyntaxVisitor<CATCH2_INTERNAL_TEST_8()::MultipleRewriter> *this,
          UdpSimpleFieldSyntax *node)

{
  size_t sVar1;
  SyntaxNode *node_00;
  size_t sVar2;
  uint uVar3;
  
  sVar1 = SyntaxNode::getChildCount((SyntaxNode *)node);
  if (sVar1 != 0) {
    uVar3 = 1;
    sVar1 = 0;
    do {
      node_00 = SyntaxNode::childNode((SyntaxNode *)node,sVar1);
      if (node_00 == (SyntaxNode *)0x0) {
        SyntaxNode::childToken((SyntaxNode *)node,sVar1);
      }
      else {
        detail::
        visitSyntaxNode<slang::syntax::SyntaxNode,CATCH2_INTERNAL_TEST_8()::MultipleRewriter>
                  (node_00,(MultipleRewriter *)this);
      }
      sVar1 = (size_t)uVar3;
      sVar2 = SyntaxNode::getChildCount((SyntaxNode *)node);
      uVar3 = uVar3 + 1;
    } while (sVar1 < sVar2);
  }
  return;
}

Assistant:

void visitDefault(T&& node) {
        for (uint32_t i = 0; i < node.getChildCount(); i++) {
            auto child = node.childNode(i);
            if (child)
                child->visit(*DERIVED);
            else {
                auto token = node.childToken(i);
                if (token)
                    DERIVED->visitToken(token);
            }
        }
    }